

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

IVal * __thiscall
deqp::gls::BuiltinPrecisionTests::
Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
::doEvaluate(IVal *__return_storage_ptr__,
            Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
            *this,EvalContext *ctx)

{
  Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *this_00;
  Expr<tcu::Vector<float,_2>_> *pEVar1;
  Expr<float> *this_01;
  Expr<deqp::gls::BuiltinPrecisionTests::Void> *this_02;
  IArg3 local_99;
  IVal local_98;
  IVal local_80;
  IVal local_50;
  EvalContext *local_20;
  EvalContext *ctx_local;
  Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *this_local;
  
  this_00 = this->m_func;
  local_20 = ctx;
  ctx_local = (EvalContext *)this;
  this_local = (Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
                *)__return_storage_ptr__;
  pEVar1 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>::
           operator->((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
                       *)&this->m_args);
  Expr<tcu::Vector<float,_2>_>::evaluate(&local_50,pEVar1,local_20);
  pEVar1 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>::
           operator->((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
                       *)&(this->m_args).b);
  Expr<tcu::Vector<float,_2>_>::evaluate(&local_80,pEVar1,local_20);
  this_01 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::operator->
                      ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> *)
                       &(this->m_args).c);
  Expr<float>::evaluate(&local_98,this_01,local_20);
  this_02 = de::
            SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
            ::operator->((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
                          *)&(this->m_args).d);
  Expr<deqp::gls::BuiltinPrecisionTests::Void>::evaluate(this_02,local_20);
  Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::apply(__return_storage_ptr__,this_00,ctx,&local_50,&local_80,&local_98,&local_99);
  return __return_storage_ptr__;
}

Assistant:

IVal				doEvaluate		(const EvalContext& ctx) const
	{
		return m_func.apply(ctx,
							m_args.a->evaluate(ctx), m_args.b->evaluate(ctx),
							m_args.c->evaluate(ctx), m_args.d->evaluate(ctx));
	}